

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O1

pair<unsigned_long,_unsigned_long> __thiscall
gtl::
dense_hashtable<unsigned_int,_unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::Identity,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::SetKey,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>
::find_position_using_hash<unsigned_int>
          (dense_hashtable<unsigned_int,_unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::Identity,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::SetKey,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>
           *this,size_type key_hash,uint *key)

{
  bool bVar1;
  size_type sVar2;
  size_type bucknum;
  long lVar3;
  size_type sVar4;
  ulong uVar5;
  ulong uVar6;
  pair<unsigned_long,_unsigned_long> pVar7;
  
  assert_key_is_not_empty_or_deleted<unsigned_int>(this,key);
  uVar5 = this->num_buckets - 1;
  bucknum = key_hash & uVar5;
  sVar4 = 0xffffffffffffffff;
  uVar6 = 0;
  do {
    bVar1 = test_empty(this,bucknum);
    if (bVar1) {
      sVar2 = bucknum;
      if (sVar4 != 0xffffffffffffffff) {
        sVar2 = sVar4;
      }
      bucknum = 0xffffffffffffffff;
LAB_00191d40:
      pVar7.second = sVar2;
      pVar7.first = bucknum;
      return pVar7;
    }
    bVar1 = test_deleted(this,bucknum);
    if (bVar1) {
      if (sVar4 == 0xffffffffffffffff) {
        sVar4 = bucknum;
      }
    }
    else {
      bVar1 = SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual::operator()
                        (&(this->key_info).super_IdKeyEqual,*key,this->table[bucknum]);
      if (bVar1) {
        sVar2 = 0xffffffffffffffff;
        goto LAB_00191d40;
      }
    }
    lVar3 = bucknum + uVar6;
    uVar6 = uVar6 + 1;
    bucknum = lVar3 + 1U & uVar5;
    if (this->num_buckets <= uVar6) {
      __assert_fail("num_probes < bucket_count() && \"Hashtable is full: an error in key_equal<> or hash<>\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/densehashtable.h"
                    ,0x41f,
                    "std::pair<size_type, size_type> gtl::dense_hashtable<unsigned int, unsigned int, SequenceLexicon<int>::IdHasher, gtl::dense_hash_set<unsigned int, SequenceLexicon<int>::IdHasher, SequenceLexicon<int>::IdKeyEqual>::Identity, gtl::dense_hash_set<unsigned int, SequenceLexicon<int>::IdHasher, SequenceLexicon<int>::IdKeyEqual>::SetKey, SequenceLexicon<int>::IdKeyEqual, std::allocator<unsigned int>>::find_position_using_hash(const size_type, const K &) const [Value = unsigned int, Key = unsigned int, HashFcn = SequenceLexicon<int>::IdHasher, ExtractKey = gtl::dense_hash_set<unsigned int, SequenceLexicon<int>::IdHasher, SequenceLexicon<int>::IdKeyEqual>::Identity, SetKey = gtl::dense_hash_set<unsigned int, SequenceLexicon<int>::IdHasher, SequenceLexicon<int>::IdKeyEqual>::SetKey, EqualKey = SequenceLexicon<int>::IdKeyEqual, Alloc = std::allocator<unsigned int>, K = unsigned int]"
                   );
    }
  } while( true );
}

Assistant:

std::pair<size_type, size_type> find_position_using_hash(
      const size_type key_hash, const K& key) const {
    assert_key_is_not_empty_or_deleted(key);
    size_type num_probes = 0;              // how many times we've probed
    const size_type bucket_count_minus_one = bucket_count() - 1;
    size_type bucknum = key_hash & bucket_count_minus_one;
    size_type insert_pos = ILLEGAL_BUCKET;  // where we would insert
    while (1) {                             // probe until something happens
      if (test_empty(bucknum)) {            // bucket is empty
        if (insert_pos == ILLEGAL_BUCKET)   // found no prior place to insert
          return std::pair<size_type, size_type>(ILLEGAL_BUCKET, bucknum);
        else
          return std::pair<size_type, size_type>(ILLEGAL_BUCKET, insert_pos);

      } else if (test_deleted(bucknum)) {
        // keep searching, but mark to insert
        if ( insert_pos == ILLEGAL_BUCKET )
          insert_pos = bucknum;

      } else if (equals(key, get_key(table[bucknum]))) {
        return std::pair<size_type, size_type>(bucknum, ILLEGAL_BUCKET);
      }
      ++num_probes;                        // we're doing another probe
      bucknum = (bucknum + JUMP_(key, num_probes)) & bucket_count_minus_one;
      assert(num_probes < bucket_count()
             && "Hashtable is full: an error in key_equal<> or hash<>");
    }
  }